

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

int __thiscall
testing::internal::FunctionMocker<int_()>::InvokeWith
          (FunctionMocker<int_()> *this,ArgumentTuple *args)

{
  bool bVar1;
  CallReaction CVar2;
  int iVar3;
  Result RVar4;
  ExpectationBase *this_00;
  char *pcVar5;
  size_t sVar6;
  void *pvVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  LogSeverity severity;
  bool is_excessive;
  ArgumentTuple *args_1;
  FailureCleanupHandler handle_failures;
  void *untyped_action;
  stringstream ss;
  stringstream why;
  stringstream loc;
  bool local_522;
  undefined1 local_521;
  ArgumentTuple *local_520;
  undefined1 local_518 [32];
  bool local_4f8;
  bool local_4f7;
  void *local_4f0;
  string local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [7];
  ios_base local_448 [264];
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base aiStack_2c0 [264];
  UninterestingCallCleanupHandler local_1b8;
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  if ((this->super_UntypedFunctionMockerBase).untyped_expectations_.
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_UntypedFunctionMockerBase).untyped_expectations_.
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_522 = false;
    std::__cxx11::stringstream::stringstream((stringstream *)local_4c8._M_local_buf);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    local_4f0 = (void *)0x0;
    local_520 = args;
    this_00 = UntypedFindMatchingExpectation
                        (this,args,&local_4f0,&local_522,(ostream *)local_4b8[0]._M_local_buf,
                         (ostream *)(local_340 + 0x10));
    local_521 = this_00 != (ExpectationBase *)0x0;
    if (((this_00 == (ExpectationBase *)0x0) || (local_522 != false)) ||
       (bVar1 = LogIsVisible(kInfo), pvVar7 = local_4f0, bVar1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b8[0]._M_local_buf,"    Function call: ",0x13);
      pcVar5 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)local_4b8 +
                        (int)*(undefined8 *)(local_4b8[0]._M_allocated_capacity - 0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b8[0]._M_local_buf,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8[0]._M_local_buf,"(",1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8[0]._M_local_buf,")",1)
      ;
      if ((this_00 != (ExpectationBase *)0x0) && ((local_522 & 1U) == 0)) {
        ExpectationBase::DescribeLocationTo(this_00,local_1a8);
      }
      pvVar7 = local_4f0;
      local_4f8 = (bool)local_521;
      local_518._0_8_ = &local_4c8;
      local_518._8_8_ = (stringstream *)local_340;
      local_518._16_8_ = &local_1b8;
      local_518._24_8_ = this_00;
      local_4f7 = local_522;
      std::__cxx11::stringbuf::str();
      iVar3 = PerformActionAndPrintResult<int,_0>
                        (this,pvVar7,local_520,&local_4e8,(ostream *)local_4b8[0]._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      UntypedFunctionMockerBase::FailureCleanupHandler::~FailureCleanupHandler
                ((FailureCleanupHandler *)local_518);
    }
    else {
      local_518._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_518 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"");
      iVar3 = PerformAction(this,pvVar7,local_520,(string *)local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_518 + 0x10)) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_518._16_8_ + 1));
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(aiStack_138);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8._M_local_buf);
    goto LAB_00111e18;
  }
  pvVar7 = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  CVar2 = Mock::GetReactionOnUninterestingCalls(pvVar7);
  if (CVar2 == kWarn) {
    severity = kWarning;
LAB_00111d69:
    bVar1 = LogIsVisible(severity);
    if (!bVar1) {
      pcVar5 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_340,pcVar5,(allocator<char> *)&local_1b8);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0x1482c1);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar9) {
        local_4b8[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_4b8[0]._8_8_ = plVar8[3];
        local_4c8._M_allocated_capacity = (size_type)local_4b8;
      }
      else {
        local_4b8[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_4c8._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_4c8._8_8_ = plVar8[1];
      *plVar8 = (long)paVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      RVar4 = PerformDefaultAction(this,args,(string *)&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_allocated_capacity != local_4b8) {
        operator_delete((void *)local_4c8._M_allocated_capacity,
                        local_4b8[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_340._0_8_ == local_340 + 0x10) {
        return RVar4;
      }
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      return RVar4;
    }
  }
  else if (CVar2 == kAllow) {
    severity = kInfo;
    goto LAB_00111d69;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_4c8._M_local_buf);
  UntypedDescribeUninterestingCall(this,args,(ostream *)local_4b8[0]._M_local_buf);
  local_1b8.reaction = CVar2;
  local_1b8.ss = (stringstream *)&local_4c8;
  std::__cxx11::stringbuf::str();
  iVar3 = PerformActionAndPrintResult<int,_0>
                    (this,(void *)0x0,args,(string *)local_340,(ostream *)local_4b8[0]._M_local_buf)
  ;
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  UntypedFunctionMockerBase::UninterestingCallCleanupHandler::~UninterestingCallCleanupHandler
            (&local_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8._M_local_buf);
LAB_00111e18:
  std::ios_base::~ios_base(local_448);
  return iVar3;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
            ? LogIsVisible(kWarning)
            :
            // Otherwise, the user wants this to be an error, and we
            // should always print detailed information in the error.
            true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->PerformDefaultAction(
          std::move(args), "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(&args, &ss);

    // Perform the action, print the result, and then report the uninteresting
    // call.
    //
    // We use RAII to do the latter in case R is void or a non-moveable type. In
    // either case we can't assign it to a local variable.
    //
    // Note that std::bind() is essential here.
    // We *don't* use any local callback types (like lambdas).
    // Doing so slows down compilation dramatically because the *constructor* of
    // std::function<T> is re-instantiated with different template
    // parameters each time.
    const UninterestingCallCleanupHandler report_uninteresting_call = {reaction,
                                                                       ss};

    return PerformActionAndPrintResult(nullptr, std::move(args), ss.str(), ss);
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.

  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(&args, &untyped_action,
                                           &is_excessive, &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return PerformAction(untyped_action, std::move(args), "");
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(&args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  // Perform the action, print the result, and then fail or log in whatever way
  // is appropriate.
  //
  // We use RAII to do the latter in case R is void or a non-moveable type. In
  // either case we can't assign it to a local variable.
  //
  // Note that we *don't* use any local callback types (like lambdas) here.
  // Doing so slows down compilation dramatically because the *constructor* of
  // std::function<T> is re-instantiated with different template
  // parameters each time.
  const FailureCleanupHandler handle_failures = {
      ss, why, loc, untyped_expectation, found, is_excessive};

  return PerformActionAndPrintResult(untyped_action, std::move(args), ss.str(),
                                     ss);
}